

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<unsigned_int,_true>::FlushSegment
          (RLECompressState<unsigned_int,_true> *this)

{
  ColumnCheckpointState *this_00;
  long in_RDI;
  BufferHandle *other;
  ColumnCheckpointState *state;
  data_ptr_t data_ptr;
  idx_t total_segment_size;
  idx_t aligned_rle_offset;
  idx_t minimal_rle_offset;
  idx_t original_rle_offset;
  idx_t counts_size;
  BufferHandle *in_stack_ffffffffffffff70;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  ColumnCheckpointState *local_40;
  data_ptr_t local_38;
  long local_30;
  ulong local_28;
  unsigned_long local_20;
  long local_18;
  size_t local_10;
  
  local_10 = *(long *)(in_RDI + 0x60) << 1;
  local_18 = *(long *)(in_RDI + 0x68) * 4 + 8;
  local_20 = *(long *)(in_RDI + 0x60) * 4 + 8;
  local_28 = AlignValue<unsigned_long,_8UL>(local_20);
  local_30 = local_28 + local_10;
  local_38 = BufferHandle::Ptr((BufferHandle *)0xa613af);
  if (local_20 < local_28) {
    memset(local_38 + local_20,0,local_28 - local_20);
  }
  memmove(local_38 + local_28,local_38 + local_18,local_10);
  Store<unsigned_long>(&local_28,local_38);
  other = (BufferHandle *)(in_RDI + 0x28);
  BufferHandle::Destroy(in_stack_ffffffffffffff70);
  this_00 = ColumnDataCheckpointData::GetCheckpointState((ColumnDataCheckpointData *)0xa61432);
  local_40 = this_00;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             this_00,(unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                      *)other);
  BufferHandle::BufferHandle((BufferHandle *)this_00,other);
  (*this_00->_vptr_ColumnCheckpointState[4])(this_00,local_48,local_60,local_30);
  BufferHandle::~BufferHandle((BufferHandle *)this_00);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa6149f);
  return;
}

Assistant:

void FlushSegment() {
		// flush the segment
		// we compact the segment by moving the counts so they are directly next to the values
		idx_t counts_size = sizeof(rle_count_t) * entry_count;
		idx_t original_rle_offset = RLEConstants::RLE_HEADER_SIZE + max_rle_count * sizeof(T);
		idx_t minimal_rle_offset = RLEConstants::RLE_HEADER_SIZE + sizeof(T) * entry_count;
		idx_t aligned_rle_offset = AlignValue(minimal_rle_offset);
		idx_t total_segment_size = aligned_rle_offset + counts_size;
		auto data_ptr = handle.Ptr();
		if (aligned_rle_offset > minimal_rle_offset) {
			memset(data_ptr + minimal_rle_offset, 0, aligned_rle_offset - minimal_rle_offset);
		}
		memmove(data_ptr + aligned_rle_offset, data_ptr + original_rle_offset, counts_size);
		// store the final RLE offset within the segment
		Store<uint64_t>(aligned_rle_offset, data_ptr);
		handle.Destroy();

		auto &state = checkpoint_data.GetCheckpointState();
		state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
	}